

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>
::RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>
                *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
  *factory;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
  *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_000000e7;
  CodeLocation *in_stack_000000e8;
  string *in_stack_000000f0;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  undefined1 *name_func;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc78;
  CodeLocation *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
  *in_stack_fffffffffffffc90;
  value_type *in_stack_fffffffffffffc98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  pointer in_stack_fffffffffffffcb0;
  CodeLocation *in_stack_fffffffffffffcc8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
  *in_stack_fffffffffffffce8;
  int line_00;
  char *in_stack_fffffffffffffcf0;
  Message *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  void *in_stack_fffffffffffffd58;
  CodeLocation *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  undefined6 in_stack_fffffffffffffd90;
  TearDownTestSuiteFunc tear_down_tc;
  _Head_base<5UL,_int,_false> local_218;
  int iStack_214;
  uint uStack_210;
  int iStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  uint uStack_200;
  aom_img_fmt aStack_1fc;
  aom_bit_depth_t local_1f8;
  uint uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
  *in_stack_fffffffffffffe28;
  string local_1c0 [32];
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  GTestLog local_170;
  GTestLog local_16c;
  undefined1 local_168 [56];
  string local_130 [104];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  TearDownTestSuiteFunc local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc78);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
                  *)in_stack_fffffffffffffc80,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
                  *)in_stack_fffffffffffffc78);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc78);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc80,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc78);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*(code *)pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = (TearDownTestSuiteFunc)pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x875cfe);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x875d29);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
      ::begin((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
               *)in_stack_fffffffffffffc88);
      while( true ) {
        ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
        ::end((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
               *)in_stack_fffffffffffffc88);
        bVar1 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                ::operator!=((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                              *)in_stack_fffffffffffffc80,
                             (ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                              *)in_stack_fffffffffffffc78);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
        ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                          *)0x875d84);
        iVar3 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffcb0);
        tear_down_tc = local_70;
        factory = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                  ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                               *)0x875e2d);
        TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
        ::TestParamInfo(in_stack_fffffffffffffc90,
                        (tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                         *)in_stack_fffffffffffffc88,(size_t)in_stack_fffffffffffffc80);
        (*tear_down_tc)(local_130,local_168);
        condition = IsValidParamName(in_stack_fffffffffffffc88);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                             in_stack_fffffffffffffcf0,line_00);
          poVar7 = GTestLog::GetStream(&local_16c);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffd80 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffd78 = std::operator<<(in_stack_fffffffffffffd80,local_130);
          in_stack_fffffffffffffd70 =
               std::operator<<(in_stack_fffffffffffffd78,"\' is invalid, in ");
          in_stack_fffffffffffffd68 = std::operator<<(in_stack_fffffffffffffd70,local_78);
          in_stack_fffffffffffffd60 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd68," line ");
          in_stack_fffffffffffffd58 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd60,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd58,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc80);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                             in_stack_fffffffffffffcf0,line_00);
          poVar7 = GTestLog::GetStream(&local_170);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc80);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        local_180 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffd07 = pVar10.second;
        local_178 = in_stack_fffffffffffffd07;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x876216);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x876233);
          in_stack_fffffffffffffcf8 =
               Message::operator<<((Message *)in_stack_fffffffffffffc80,
                                   &in_stack_fffffffffffffc78->file);
          Message::operator<<((Message *)in_stack_fffffffffffffc80,
                              (char (*) [2])in_stack_fffffffffffffc78);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->file);
        in_stack_fffffffffffffcf0 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffc88);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffce8 =
             ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
             ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                          *)0x8762c8);
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,int,unsigned_int,int,int>>
                  (in_stack_fffffffffffffe28);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x876302);
        CodeLocation::CodeLocation(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc78 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LFControlEndToEndTestThreaded>::
             GetSetUpCaseOrSuite(filename,iVar3);
        in_stack_fffffffffffffc80 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::LFControlEndToEndTestThreaded>::
             GetTearDownCaseOrSuite(filename,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x876373);
        in_stack_fffffffffffffcb0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>_>_>
                           *)0x87637f);
        ptVar9 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                 ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                              *)0x876391);
        local_218._M_head_impl =
             (ptVar9->
             super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
             ).
             super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
             .super__Tuple_impl<2UL,_int,_unsigned_int,_int,_int>.
             super__Tuple_impl<3UL,_unsigned_int,_int,_int>.super__Tuple_impl<4UL,_int,_int>.
             super__Tuple_impl<5UL,_int>.super__Head_base<5UL,_int,_false>._M_head_impl;
        iStack_214 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Tuple_impl<2UL,_int,_unsigned_int,_int,_int>.
                     super__Tuple_impl<3UL,_unsigned_int,_int,_int>.super__Tuple_impl<4UL,_int,_int>
                     .super__Head_base<4UL,_int,_false>._M_head_impl;
        uStack_210 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Tuple_impl<2UL,_int,_unsigned_int,_int,_int>.
                     super__Tuple_impl<3UL,_unsigned_int,_int,_int>.
                     super__Head_base<3UL,_unsigned_int,_false>._M_head_impl;
        iStack_20c = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Tuple_impl<2UL,_int,_unsigned_int,_int,_int>.
                     super__Head_base<2UL,_int,_false>._M_head_impl;
        local_208 = *(undefined4 *)
                     &(ptVar9->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                      ).
                      super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                      .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                      _M_head_impl.filename;
        uStack_204 = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                              ).
                              super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                              .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                              _M_head_impl.filename + 4);
        uStack_200 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                     _M_head_impl.input_bit_depth;
        aStack_1fc = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                     _M_head_impl.fmt;
        local_1f8 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                    ).
                    super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                    .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                    _M_head_impl.bit_depth;
        uStack_1f4 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     ).
                     super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                     .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>.
                     _M_head_impl.profile;
        uStack_1f0 = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>.
                       _M_head_impl;
        uStack_1ec = *(undefined4 *)
                      ((long)&(ptVar9->
                              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>
                              ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>.
                              _M_head_impl + 4);
        iVar3 = (*in_stack_fffffffffffffcb0->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffcb0,&local_218);
        in_stack_fffffffffffffc88 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffca8 = in_stack_fffffffffffffc88;
        in_stack_fffffffffffffcc8 = in_stack_fffffffffffffc78;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   (char *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffd90))
                   ,tear_down_tc,(TestFactoryBase *)factory);
        CodeLocation::~CodeLocation((CodeLocation *)0x87642e);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_130);
        Message::~Message((Message *)0x876462);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
        ::operator++((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                      *)in_stack_fffffffffffffc80);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
      ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                        *)0x875d9c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x876527);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_int,_unsigned_int,_int,_int>_>
                         *)0x876541);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>
                   *)0x876589);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::LFControlEndToEndTestThreaded>::TestInfo>_>_>
             *)in_stack_fffffffffffffc90);
    InsertSyntheticTestCase(in_stack_000000f0,in_stack_000000e8,in_stack_000000e7);
    CodeLocation::~CodeLocation((CodeLocation *)0x876623);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }